

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppgenerator.cpp
# Opt level: O0

void __thiscall CppGenerator::generateDecl(CppGenerator *this,QTextStream *out)

{
  bool bVar1;
  QTextStream *pQVar2;
  reference p_Var3;
  difference_type dVar4;
  size_type sVar5;
  qsizetype qVar6;
  QTextStream *in_RSI;
  CppGenerator *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar7;
  int value;
  Name *t;
  add_const_t<std::set<std::_List_iterator<QString>_>_> *__range1;
  QString prot;
  QString name;
  iterator __end1;
  iterator __begin1;
  set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
  *in_stack_fffffffffffffef8;
  QLatin1StringView *in_stack_ffffffffffffff00;
  char *s;
  QString *in_stack_ffffffffffffff08;
  char *pcVar8;
  _List_iterator<QString> in_stack_ffffffffffffff10;
  _List_iterator<QString> in_stack_ffffffffffffff18;
  QLatin1String *local_c0;
  QLatin1String *local_b0;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  QLatin1StringView local_58;
  QLatin1StringView local_48;
  _List_node_base *local_38;
  QString local_30;
  _Self local_18;
  _Self local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QTextStream *)QTextStream::operator<<(in_RSI,"class ");
  QTextStream::operator<<(pQVar2,(QString *)&in_RDI->grammar->table_name);
  pQVar2 = operator<<((QTextStream *)in_stack_ffffffffffffff00,
                      (QTextStreamFunction)in_stack_fffffffffffffef8);
  QTextStream::operator<<(pQVar2,"{");
  pQVar2 = operator<<((QTextStream *)in_stack_ffffffffffffff00,
                      (QTextStreamFunction)in_stack_fffffffffffffef8);
  QTextStream::operator<<(pQVar2,"public:");
  pQVar2 = operator<<((QTextStream *)in_stack_ffffffffffffff00,
                      (QTextStreamFunction)in_stack_fffffffffffffef8);
  QTextStream::operator<<(pQVar2,"    enum VariousConstants {");
  operator<<((QTextStream *)in_stack_ffffffffffffff00,(QTextStreamFunction)in_stack_fffffffffffffef8
            );
  local_10._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
  local_10._M_node =
       (_Base_ptr)
       std::
       set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
       ::begin(in_stack_fffffffffffffef8);
  local_18._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
  local_18._M_node =
       (_Base_ptr)
       std::
       set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
       ::end(in_stack_fffffffffffffef8);
  while (bVar1 = std::operator!=(&local_10,&local_18), bVar1) {
    p_Var3 = std::_Rb_tree_const_iterator<std::_List_iterator<QString>_>::operator*
                       ((_Rb_tree_const_iterator<std::_List_iterator<QString>_> *)0x10e316);
    local_30.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_30.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_30.d.size = -0x5555555555555556;
    std::_List_iterator<QString>::operator*((_List_iterator<QString> *)0x10e352);
    QString::QString((QString *)in_stack_ffffffffffffff00,(QString *)in_stack_fffffffffffffef8);
    std::__cxx11::list<QString,_std::allocator<QString>_>::begin
              ((list<QString,_std::allocator<QString>_> *)in_stack_ffffffffffffff00);
    local_38 = p_Var3->_M_node;
    dVar4 = std::distance<std::_List_iterator<QString>>
                      (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    local_48 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_ffffffffffffff08,(size_t)in_stack_ffffffffffffff00);
    bVar1 = ::operator==(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    if (bVar1) {
      QVar7 = Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_stack_ffffffffffffff08,(size_t)in_stack_ffffffffffffff00);
      local_b0 = (QLatin1String *)QVar7.m_size;
      QString::operator=(&local_30,local_b0);
    }
    else {
      local_58 = Qt::Literals::StringLiterals::operator____L1
                           ((char *)in_stack_ffffffffffffff08,(size_t)in_stack_ffffffffffffff00);
      bVar1 = ::operator==(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      if (bVar1) {
        QVar7 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_ffffffffffffff08,(size_t)in_stack_ffffffffffffff00);
        local_c0 = (QLatin1String *)QVar7.m_size;
        QString::operator=(&local_30,local_c0);
      }
      else {
        QString::prepend((QString *)in_stack_ffffffffffffff00,(QString *)in_stack_fffffffffffffef8);
      }
    }
    pQVar2 = (QTextStream *)QTextStream::operator<<(in_RSI,"        ");
    pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,(QString *)&local_30);
    pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2," = ");
    pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,(int)dVar4);
    QTextStream::operator<<(pQVar2,",");
    operator<<((QTextStream *)in_stack_ffffffffffffff00,
               (QTextStreamFunction)in_stack_fffffffffffffef8);
    QString::~QString((QString *)0x10e508);
    std::_Rb_tree_const_iterator<std::_List_iterator<QString>_>::operator++
              ((_Rb_tree_const_iterator<std::_List_iterator<QString>_> *)in_stack_ffffffffffffff00);
  }
  pQVar2 = operator<<((QTextStream *)in_stack_ffffffffffffff00,
                      (QTextStreamFunction)in_stack_fffffffffffffef8);
  pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,"        ACCEPT_STATE = ");
  pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,in_RDI->accept_state);
  QTextStream::operator<<(pQVar2,",");
  pQVar2 = operator<<((QTextStream *)in_stack_ffffffffffffff00,
                      (QTextStreamFunction)in_stack_fffffffffffffef8);
  pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,"        RULE_COUNT = ");
  sVar5 = std::__cxx11::list<Rule,_std::allocator<Rule>_>::size
                    ((list<Rule,_std::allocator<Rule>_> *)0x10e597);
  pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,sVar5);
  QTextStream::operator<<(pQVar2,",");
  pQVar2 = operator<<((QTextStream *)in_stack_ffffffffffffff00,
                      (QTextStreamFunction)in_stack_fffffffffffffef8);
  pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,"        STATE_COUNT = ");
  pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,in_RDI->state_count);
  QTextStream::operator<<(pQVar2,",");
  pQVar2 = operator<<((QTextStream *)in_stack_ffffffffffffff00,
                      (QTextStreamFunction)in_stack_fffffffffffffef8);
  pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,"        TERMINAL_COUNT = ");
  pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,in_RDI->terminal_count);
  QTextStream::operator<<(pQVar2,",");
  pQVar2 = operator<<((QTextStream *)in_stack_ffffffffffffff00,
                      (QTextStreamFunction)in_stack_fffffffffffffef8);
  pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,"        NON_TERMINAL_COUNT = ");
  pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,in_RDI->non_terminal_count);
  QTextStream::operator<<(pQVar2,",");
  operator<<((QTextStream *)in_stack_ffffffffffffff00,(QTextStreamFunction)in_stack_fffffffffffffef8
            );
  pQVar2 = operator<<((QTextStream *)in_stack_ffffffffffffff00,
                      (QTextStreamFunction)in_stack_fffffffffffffef8);
  pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,"        GOTO_INDEX_OFFSET = ");
  qVar6 = QList<int>::size(&(in_RDI->compressed_action).index);
  pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,qVar6);
  QTextStream::operator<<(pQVar2,",");
  pQVar2 = operator<<((QTextStream *)in_stack_ffffffffffffff00,
                      (QTextStreamFunction)in_stack_fffffffffffffef8);
  pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,"        GOTO_INFO_OFFSET = ");
  qVar6 = QList<int>::size(&(in_RDI->compressed_action).info);
  pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,qVar6);
  QTextStream::operator<<(pQVar2,",");
  pQVar2 = operator<<((QTextStream *)in_stack_ffffffffffffff00,
                      (QTextStreamFunction)in_stack_fffffffffffffef8);
  pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,"        GOTO_CHECK_OFFSET = ");
  qVar6 = QList<int>::size(&(in_RDI->compressed_action).check);
  QTextStream::operator<<(pQVar2,qVar6);
  pQVar2 = operator<<((QTextStream *)in_stack_ffffffffffffff00,
                      (QTextStreamFunction)in_stack_fffffffffffffef8);
  QTextStream::operator<<(pQVar2,"    };");
  operator<<((QTextStream *)in_stack_ffffffffffffff00,(QTextStreamFunction)in_stack_fffffffffffffef8
            );
  pQVar2 = operator<<((QTextStream *)in_stack_ffffffffffffff00,
                      (QTextStreamFunction)in_stack_fffffffffffffef8);
  QTextStream::operator<<(pQVar2,"    static const char *const     spell[];");
  pQVar2 = operator<<((QTextStream *)in_stack_ffffffffffffff00,
                      (QTextStreamFunction)in_stack_fffffffffffffef8);
  QTextStream::operator<<(pQVar2,"    static const short             lhs[];");
  pQVar2 = operator<<((QTextStream *)in_stack_ffffffffffffff00,
                      (QTextStreamFunction)in_stack_fffffffffffffef8);
  QTextStream::operator<<(pQVar2,"    static const short             rhs[];");
  operator<<((QTextStream *)in_stack_ffffffffffffff00,(QTextStreamFunction)in_stack_fffffffffffffef8
            );
  if ((in_RDI->debug_info & 1U) != 0) {
    local_70 = 0xaaaaaaaaaaaaaaaa;
    local_68 = 0xaaaaaaaaaaaaaaaa;
    local_60 = 0xaaaaaaaaaaaaaaaa;
    debugInfoProt(in_RDI);
    pQVar2 = operator<<((QTextStream *)in_stack_ffffffffffffff00,
                        (QTextStreamFunction)in_stack_fffffffffffffef8);
    pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,"#ifndef ");
    QTextStream::operator<<(pQVar2,(QString *)&local_70);
    pQVar2 = operator<<((QTextStream *)in_stack_ffffffffffffff00,
                        (QTextStreamFunction)in_stack_fffffffffffffef8);
    QTextStream::operator<<(pQVar2,"    static const int     rule_index[];");
    pQVar2 = operator<<((QTextStream *)in_stack_ffffffffffffff00,
                        (QTextStreamFunction)in_stack_fffffffffffffef8);
    QTextStream::operator<<(pQVar2,"    static const int      rule_info[];");
    pQVar2 = operator<<((QTextStream *)in_stack_ffffffffffffff00,
                        (QTextStreamFunction)in_stack_fffffffffffffef8);
    pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,"#endif // ");
    QTextStream::operator<<(pQVar2,(QString *)&local_70);
    operator<<((QTextStream *)in_stack_ffffffffffffff00,
               (QTextStreamFunction)in_stack_fffffffffffffef8);
    operator<<((QTextStream *)in_stack_ffffffffffffff00,
               (QTextStreamFunction)in_stack_fffffffffffffef8);
    QString::~QString((QString *)0x10e905);
  }
  QTextStream::operator<<(in_RSI,"    static const short    goto_default[];");
  pQVar2 = operator<<((QTextStream *)in_stack_ffffffffffffff00,
                      (QTextStreamFunction)in_stack_fffffffffffffef8);
  QTextStream::operator<<(pQVar2,"    static const short  action_default[];");
  pQVar2 = operator<<((QTextStream *)in_stack_ffffffffffffff00,
                      (QTextStreamFunction)in_stack_fffffffffffffef8);
  QTextStream::operator<<(pQVar2,"    static const short    action_index[];");
  pQVar2 = operator<<((QTextStream *)in_stack_ffffffffffffff00,
                      (QTextStreamFunction)in_stack_fffffffffffffef8);
  QTextStream::operator<<(pQVar2,"    static const short     action_info[];");
  pQVar2 = operator<<((QTextStream *)in_stack_ffffffffffffff00,
                      (QTextStreamFunction)in_stack_fffffffffffffef8);
  QTextStream::operator<<(pQVar2,"    static const short    action_check[];");
  operator<<((QTextStream *)in_stack_ffffffffffffff00,(QTextStreamFunction)in_stack_fffffffffffffef8
            );
  pQVar2 = operator<<((QTextStream *)in_stack_ffffffffffffff00,
                      (QTextStreamFunction)in_stack_fffffffffffffef8);
  QTextStream::operator<<(pQVar2,"    static inline int nt_action (int state, int nt)");
  pQVar2 = operator<<((QTextStream *)in_stack_ffffffffffffff00,
                      (QTextStreamFunction)in_stack_fffffffffffffef8);
  s = "    {";
  QTextStream::operator<<(pQVar2,"    {");
  pQVar2 = operator<<((QTextStream *)s,(QTextStreamFunction)in_stack_fffffffffffffef8);
  QTextStream::operator<<
            (pQVar2,"        const int yyn = action_index [GOTO_INDEX_OFFSET + state] + nt;");
  pQVar2 = operator<<((QTextStream *)s,(QTextStreamFunction)in_stack_fffffffffffffef8);
  QTextStream::operator<<
            (pQVar2,"        if (yyn < 0 || action_check [GOTO_CHECK_OFFSET + yyn] != nt)");
  pQVar2 = operator<<((QTextStream *)s,(QTextStreamFunction)in_stack_fffffffffffffef8);
  QTextStream::operator<<(pQVar2,"            return goto_default [nt];");
  operator<<((QTextStream *)s,(QTextStreamFunction)in_stack_fffffffffffffef8);
  pQVar2 = operator<<((QTextStream *)s,(QTextStreamFunction)in_stack_fffffffffffffef8);
  QTextStream::operator<<(pQVar2,"        return action_info [GOTO_INFO_OFFSET + yyn];");
  pQVar2 = operator<<((QTextStream *)s,(QTextStreamFunction)in_stack_fffffffffffffef8);
  pcVar8 = "    }";
  QTextStream::operator<<(pQVar2,"    }");
  operator<<((QTextStream *)s,(QTextStreamFunction)in_stack_fffffffffffffef8);
  pQVar2 = operator<<((QTextStream *)s,(QTextStreamFunction)in_stack_fffffffffffffef8);
  QTextStream::operator<<(pQVar2,"    static inline int t_action (int state, int token)");
  pQVar2 = operator<<((QTextStream *)s,(QTextStreamFunction)in_stack_fffffffffffffef8);
  QTextStream::operator<<(pQVar2,s);
  pQVar2 = operator<<((QTextStream *)s,(QTextStreamFunction)in_stack_fffffffffffffef8);
  QTextStream::operator<<(pQVar2,"        const int yyn = action_index [state] + token;");
  operator<<((QTextStream *)s,(QTextStreamFunction)in_stack_fffffffffffffef8);
  pQVar2 = operator<<((QTextStream *)s,(QTextStreamFunction)in_stack_fffffffffffffef8);
  QTextStream::operator<<(pQVar2,"        if (yyn < 0 || action_check [yyn] != token)");
  pQVar2 = operator<<((QTextStream *)s,(QTextStreamFunction)in_stack_fffffffffffffef8);
  QTextStream::operator<<(pQVar2,"            return - action_default [state];");
  operator<<((QTextStream *)s,(QTextStreamFunction)in_stack_fffffffffffffef8);
  pQVar2 = operator<<((QTextStream *)s,(QTextStreamFunction)in_stack_fffffffffffffef8);
  QTextStream::operator<<(pQVar2,"        return action_info [yyn];");
  pQVar2 = operator<<((QTextStream *)s,(QTextStreamFunction)in_stack_fffffffffffffef8);
  QTextStream::operator<<(pQVar2,pcVar8);
  pQVar2 = operator<<((QTextStream *)s,(QTextStreamFunction)in_stack_fffffffffffffef8);
  QTextStream::operator<<(pQVar2,"};");
  operator<<((QTextStream *)s,(QTextStreamFunction)in_stack_fffffffffffffef8);
  operator<<((QTextStream *)s,(QTextStreamFunction)in_stack_fffffffffffffef8);
  operator<<((QTextStream *)s,(QTextStreamFunction)in_stack_fffffffffffffef8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CppGenerator::generateDecl (QTextStream &out)
{
  out << "class " << grammar.table_name << Qt::endl
      << "{" << Qt::endl
      << "public:" << Qt::endl
      << "    enum VariousConstants {" << Qt::endl;

  for (const Name &t : std::as_const(grammar.terminals))
    {
      QString name = *t;
      int value = std::distance (grammar.names.begin (), t);

      if (name == "$end"_L1)
        name = "EOF_SYMBOL"_L1;

      else if (name == "$accept"_L1)
        name = "ACCEPT_SYMBOL"_L1;

      else
        name.prepend (grammar.token_prefix);

      out << "        " << name << " = " << value << "," << Qt::endl;
    }

  out << Qt::endl
      << "        ACCEPT_STATE = " << accept_state << "," << Qt::endl
      << "        RULE_COUNT = " << grammar.rules.size () << "," << Qt::endl
      << "        STATE_COUNT = " << state_count << "," << Qt::endl
      << "        TERMINAL_COUNT = " << terminal_count << "," << Qt::endl
      << "        NON_TERMINAL_COUNT = " << non_terminal_count << "," << Qt::endl
      << Qt::endl
      << "        GOTO_INDEX_OFFSET = " << compressed_action.index.size () << "," << Qt::endl
      << "        GOTO_INFO_OFFSET = " << compressed_action.info.size () << "," << Qt::endl
      << "        GOTO_CHECK_OFFSET = " << compressed_action.check.size () << Qt::endl
      << "    };" << Qt::endl
      << Qt::endl
      << "    static const char *const     spell[];" << Qt::endl
      << "    static const short             lhs[];" << Qt::endl
      << "    static const short             rhs[];" << Qt::endl;

  if (debug_info)
    {
      QString prot = debugInfoProt();

      out << Qt::endl << "#ifndef " << prot << Qt::endl
          << "    static const int     rule_index[];" << Qt::endl
          << "    static const int      rule_info[];" << Qt::endl
          << "#endif // " << prot << Qt::endl << Qt::endl;
    }

  out << "    static const short    goto_default[];" << Qt::endl
      << "    static const short  action_default[];" << Qt::endl
      << "    static const short    action_index[];" << Qt::endl
      << "    static const short     action_info[];" << Qt::endl
      << "    static const short    action_check[];" << Qt::endl
      << Qt::endl
      << "    static inline int nt_action (int state, int nt)" << Qt::endl
      << "    {" << Qt::endl
      << "        const int yyn = action_index [GOTO_INDEX_OFFSET + state] + nt;" << Qt::endl
      << "        if (yyn < 0 || action_check [GOTO_CHECK_OFFSET + yyn] != nt)" << Qt::endl
      << "            return goto_default [nt];" << Qt::endl
      << Qt::endl
      << "        return action_info [GOTO_INFO_OFFSET + yyn];" << Qt::endl
      << "    }" << Qt::endl
      << Qt::endl
      << "    static inline int t_action (int state, int token)" << Qt::endl
      << "    {" << Qt::endl
      << "        const int yyn = action_index [state] + token;" << Qt::endl
      << Qt::endl
      << "        if (yyn < 0 || action_check [yyn] != token)" << Qt::endl
      << "            return - action_default [state];" << Qt::endl
      << Qt::endl
      << "        return action_info [yyn];" << Qt::endl
      << "    }" << Qt::endl
      << "};" << Qt::endl
      << Qt::endl
      << Qt::endl;
}